

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall SmallArray<NamespaceData_*,_2U>::~SmallArray(SmallArray<NamespaceData_*,_2U> *this)

{
  NamespaceData **ppNVar1;
  
  ppNVar1 = this->data;
  if (ppNVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppNVar1 != (NamespaceData **)0x0) {
        (*(code *)NULLC::dealloc)(ppNVar1);
      }
    }
    else if (ppNVar1 != (NamespaceData **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}